

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbios_mgmt.c
# Opt level: O2

int vbios_read(char *filename,uint8_t **vbios,uint16_t *length)

{
  FILE *__stream;
  long lVar1;
  uint8_t *puVar2;
  size_t sVar3;
  int iVar4;
  ulong __size;
  
  if (length == (uint16_t *)0x0 || vbios == (uint8_t **)0x0) {
    iVar4 = -4;
  }
  else {
    *vbios = (uint8_t *)0x0;
    *length = 0;
    __stream = fopen(filename,"rb");
    iVar4 = -3;
    if (__stream != (FILE *)0x0) {
      fseek(__stream,0,2);
      lVar1 = ftell(__stream);
      *length = (uint16_t)lVar1;
      fseek(__stream,0,0);
      __size = (ulong)*length;
      if (__size != 0) {
        puVar2 = (uint8_t *)malloc(__size);
        *vbios = puVar2;
        sVar3 = fread(puVar2,1,__size,__stream);
        if (sVar3 < *length) {
          free(*vbios);
        }
        else {
          fclose(__stream);
          puVar2 = *vbios;
          iVar4 = -5;
          if ((*puVar2 == 'U') && (puVar2[1] == 0xaa)) {
            *length = (ushort)puVar2[2] << 9;
            iVar4 = 1;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int vbios_read(const char *filename, uint8_t **vbios, uint16_t *length)
{
	FILE * fd_bios;

	if (!vbios || !length)
		return EARG;
	*vbios = NULL;
	*length = 0;

	fd_bios = fopen(filename ,"rb");
	if (!fd_bios)
		return EIOFAIL;

	/* get the size */
	fseek(fd_bios, 0, SEEK_END);
	*length = ftell(fd_bios);
	fseek(fd_bios, 0, SEEK_SET);

	if (*length <= 0)
		return EIOFAIL;

	/* Read the vbios */
	*vbios = malloc(*length * sizeof(char));
	if (fread(*vbios, 1, *length, fd_bios) < *length) {
		free(*vbios);
		return EIOFAIL;
	}
	fclose (fd_bios);

	/* vbios verification */
	if ((*vbios)[0] != 0x55 || (*vbios)[1] != 0xaa)
		return ENOTVBIOS;

	/* Set the right length */
	*length = (*vbios)[2] * 512;

	return EOK;
}